

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  _Head_base<1UL,_re2::PODArray<int>::Deleter,_false> _Var1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  iterator iVar5;
  int *piVar6;
  Inst *pIVar7;
  IndexValue *pIVar8;
  Deleter *pDVar9;
  pointer pvVar10;
  Deleter *pDVar11;
  IndexValue *pIVar12;
  bool bVar13;
  uint uVar14;
  Deleter *pDVar15;
  Deleter *pDVar16;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false> _Var17;
  bool bVar18;
  Deleter local_48;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_44;
  SparseArray<int> *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  reachable->size_ = 0;
  piVar4 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar4) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar4;
  }
  iVar5._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_48.len_ = root;
  local_40 = predmap;
  local_38 = predvec;
  if (iVar5._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar5,&local_48.len_);
  }
  else {
    *iVar5._M_current = root;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar5._M_current + 1;
  }
  do {
    piVar4 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar4) {
      if (reachable->size_ != 0) {
        pDVar9 = (Deleter *)
                 (reachable->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        pIVar8 = (local_40->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
        pDVar15 = pDVar9;
        do {
          if ((pIVar8 != (IndexValue *)0x0) &&
             (_Var17._M_head_impl.len_ = (Deleter)pDVar15->len_,
             (uint)_Var17._M_head_impl.len_ <
             (uint)*(int *)&(local_40->dense_).ptr_._M_t.
                            super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                            .
                            super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                            .
                            super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
             )) {
            uVar14 = (local_40->sparse_).ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)_Var17._M_head_impl.len_]
            ;
            if ((uVar14 < (uint)local_40->size_) &&
               ((Deleter)pIVar8[(int)uVar14].index_ == _Var17._M_head_impl.len_)) {
              pvVar10 = (local_38->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pDVar11 = *(Deleter **)
                         ((long)&pvVar10[pIVar8[(local_40->sparse_).ptr_._M_t.
                                                super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>
                                                .super__Head_base<0UL,_int_*,_false>._M_head_impl
                                                [(int)_Var17._M_head_impl.len_]].value_].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + 8);
              for (pDVar16 = *(Deleter **)
                              &pvVar10[pIVar8[(local_40->sparse_).ptr_._M_t.
                                              super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>
                                              .super__Head_base<0UL,_int_*,_false>._M_head_impl
                                              [(int)_Var17._M_head_impl.len_]].value_].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data; pDVar16 != pDVar11; pDVar16 = pDVar16 + 1) {
                if ((((pDVar9 == (Deleter *)0x0) ||
                     (_Var1._M_head_impl.len_ = (Deleter)pDVar16->len_,
                     (uint)*(int *)&(reachable->dense_).ptr_._M_t.
                                    super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                                    super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                                    super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false> <=
                     (uint)_Var1._M_head_impl.len_)) ||
                    (uVar14 = (reachable->sparse_).ptr_._M_t.
                              super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                              super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl
                              [(int)_Var1._M_head_impl.len_], (uint)reachable->size_ <= uVar14)) ||
                   ((Deleter)pDVar9[(int)uVar14].len_ != _Var1._M_head_impl.len_)) {
                  pIVar12 = (rootmap->dense_).ptr_._M_t.
                            super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                            .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>.
                            _M_head_impl;
                  bVar18 = pIVar12 != (IndexValue *)0x0;
                  bVar13 = (uint)_Var17._M_head_impl.len_ <
                           (uint)*(int *)&(rootmap->dense_).ptr_._M_t.
                                          super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                                          .
                                          super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                                          .
                                          super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
                  ;
                  if (bVar13 && bVar18) {
                    uVar14 = (rootmap->sparse_).ptr_._M_t.
                             super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl
                             [(int)_Var17._M_head_impl.len_];
                    if (uVar14 < (uint)rootmap->size_) {
                      if ((bVar13 && bVar18) &&
                          (Deleter)pIVar12[(int)uVar14].index_ != _Var17._M_head_impl.len_) {
LAB_001cf7d0:
                        iVar2 = rootmap->size_;
                        piVar6 = (rootmap->sparse_).ptr_._M_t.
                                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
                        piVar6[(int)_Var17._M_head_impl.len_] = iVar2;
                        iVar3 = rootmap->size_;
                        pIVar12[iVar3].index_ = (int)_Var17._M_head_impl.len_;
                        rootmap->size_ = iVar3 + 1;
                        pIVar12[piVar6[(int)_Var17._M_head_impl.len_]].value_ = iVar2;
                      }
                    }
                    else if (bVar13 && bVar18) goto LAB_001cf7d0;
                  }
                }
              }
            }
          }
          pDVar15 = pDVar15 + 1;
        } while (pDVar15 != pDVar9 + reachable->size_);
      }
      return;
    }
    _Var17._M_head_impl.len_ = (Deleter)piVar4[-1];
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar4 + -1;
    do {
      piVar6 = (reachable->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
               ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if ((((piVar6 != (int *)0x0) &&
           ((uint)_Var17._M_head_impl.len_ <
            (uint)*(int *)&(reachable->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                           super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                           super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>)) &&
          ((uVar14 = (reachable->sparse_).ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)_Var17._M_head_impl.len_]
           , uVar14 < (uint)reachable->size_ &&
           ((Deleter)piVar6[(int)uVar14] == _Var17._M_head_impl.len_)))) ||
         (((SparseSetT<void>::InsertInternal(reachable,false,(int)_Var17._M_head_impl.len_),
           _Var17._M_head_impl.len_ != (Deleter)local_48.len_ &&
           (pIVar8 = (rootmap->dense_).ptr_._M_t.
                     super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                     .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
           , pIVar8 != (IndexValue *)0x0)) &&
          (((uint)_Var17._M_head_impl.len_ <
            (uint)*(int *)&(rootmap->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
           && ((uVar14 = (rootmap->sparse_).ptr_._M_t.
                         super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl
                         [(int)_Var17._M_head_impl.len_], uVar14 < (uint)rootmap->size_ &&
               ((Deleter)pIVar8[(int)uVar14].index_ == _Var17._M_head_impl.len_)))))))) break;
      pIVar7 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar14 = pIVar7[(int)_Var17._M_head_impl.len_].out_opcode_ & 7;
      bVar13 = false;
      if ((0xbcU >> uVar14 & 1) == 0) {
        if ((3U >> uVar14 & 1) == 0) {
          _Var17._M_head_impl.len_ =
               (Deleter)(pIVar7[(int)_Var17._M_head_impl.len_].out_opcode_ >> 4);
          bVar13 = true;
        }
        else {
          local_44 = pIVar7[(int)_Var17._M_head_impl.len_].field_1;
          iVar5._M_current =
               (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar5._M_current ==
              (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar5,&local_44.cap_)
            ;
          }
          else {
            *iVar5._M_current = (int)local_44;
            (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar5._M_current + 1;
          }
          _Var17._M_head_impl.len_ =
               (Deleter)(pIVar7[(int)_Var17._M_head_impl.len_].out_opcode_ >> 4);
          bVar13 = true;
        }
      }
    } while (bVar13);
  } while( true );
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}